

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sort.hpp
# Opt level: O3

bool tf::detail::
     partial_insertion_sort<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,std::less<std::__cxx11::string>>
               (string *begin,string *end)

{
  int iVar1;
  string *psVar2;
  long lVar3;
  long lVar4;
  string *psVar5;
  string *psVar6;
  long lVar7;
  bool bVar8;
  T tmp;
  string *local_58;
  undefined8 local_50;
  long local_48;
  undefined8 uStack_40;
  string *local_38;
  
  bVar8 = true;
  if ((begin != end) && (begin + 0x20 != end)) {
    lVar3 = 0;
    lVar4 = 0;
    psVar6 = begin + 0x20;
    psVar5 = begin;
    local_38 = end;
    do {
      psVar2 = psVar6;
      iVar1 = std::__cxx11::string::compare(psVar2);
      if (iVar1 < 0) {
        local_58 = (string *)&local_48;
        psVar6 = psVar5 + 0x30;
        if (*(string **)psVar2 == psVar6) {
          local_48 = *(long *)psVar6;
          uStack_40 = *(undefined8 *)(psVar5 + 0x38);
        }
        else {
          local_48 = *(long *)psVar6;
          local_58 = *(string **)psVar2;
        }
        local_50 = *(undefined8 *)(psVar5 + 0x28);
        *(string **)psVar2 = psVar6;
        *(undefined8 *)(psVar5 + 0x28) = 0;
        psVar5[0x30] = (string)0x0;
        lVar7 = lVar3;
        do {
          std::__cxx11::string::operator=(psVar5 + 0x20,psVar5);
          psVar6 = begin;
          if (lVar7 == 0) break;
          iVar1 = std::__cxx11::string::compare((string *)&local_58);
          lVar7 = lVar7 + 0x20;
          psVar6 = psVar5;
          psVar5 = psVar5 + -0x20;
        } while (iVar1 < 0);
        std::__cxx11::string::operator=(psVar6,(string *)&local_58);
        end = local_38;
        if (local_58 != (string *)&local_48) {
          operator_delete(local_58,local_48 + 1);
        }
        lVar4 = lVar4 + ((long)psVar2 - (long)psVar6 >> 5);
      }
      bVar8 = psVar2 + 0x20 == end;
    } while ((!bVar8) && (lVar3 = lVar3 + -0x20, psVar6 = psVar2 + 0x20, psVar5 = psVar2, lVar4 < 9)
            );
  }
  return bVar8;
}

Assistant:

bool partial_insertion_sort(RandItr begin, RandItr end, Compare comp) {

  using T = typename std::iterator_traits<RandItr>::value_type;
  using D = typename std::iterator_traits<RandItr>::difference_type;

  // When we detect an already sorted partition, attempt an insertion sort
  // that allows this amount of element moves before giving up.
  constexpr auto partial_insertion_sort_limit = D{8};

  if (begin == end) return true;

  auto limit = D{0};

  for (RandItr cur = begin + 1; cur != end; ++cur) {

    if (limit > partial_insertion_sort_limit) {
      return false;
    }

    RandItr shift = cur;
    RandItr shift_1 = cur - 1;

    // Compare first so we can avoid 2 moves
    // for an element already positioned correctly.
    if (comp(*shift, *shift_1)) {
      T tmp = std::move(*shift);

      do {
        *shift-- = std::move(*shift_1);
      }while (shift != begin && comp(tmp, *--shift_1));

      *shift = std::move(tmp);
      limit += cur - shift;
    }
  }

  return true;
}